

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_atan>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long *in_RDI;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 in_ZMM3 [64];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_atan op;
  Mat *m;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_1;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_1;
  undefined1 local_1a50 [16];
  undefined1 local_1a40 [32];
  int local_1a1c;
  undefined8 local_1a18;
  undefined8 local_1a10;
  undefined8 local_1a08;
  undefined4 local_1a00;
  long local_19f8;
  undefined4 local_19f0;
  undefined4 local_19ec;
  undefined4 local_19e8;
  undefined4 local_19e4;
  undefined4 local_19e0;
  undefined8 local_19d8;
  undefined1 (*local_19d0) [32];
  int local_19c8;
  int local_19c4;
  int local_19c0;
  int local_19bc;
  int local_19b8;
  int local_19b4;
  int local_19b0;
  undefined1 local_19a9 [9];
  long *local_19a0;
  undefined1 local_1995;
  int local_1994;
  undefined8 *local_1988;
  undefined8 *local_1980;
  undefined8 *local_1970;
  undefined1 (*local_1968) [32];
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined1 (*local_1930) [32];
  undefined1 (*local_1928) [32];
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined1 (*local_1910) [32];
  long local_1908;
  undefined4 local_18fc;
  long local_18f8;
  undefined1 (*local_18f0) [32];
  undefined4 local_18e4;
  int local_18e0;
  int local_18dc;
  undefined8 *local_18d8;
  undefined4 local_18cc;
  long local_18c8;
  undefined8 *local_18b8;
  undefined1 *local_1890;
  undefined1 *local_1888;
  undefined1 *local_1880;
  undefined1 *local_1878;
  undefined1 (*local_1870) [32];
  undefined1 *local_1868;
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1740;
  float fStack_173c;
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  float *local_1318;
  float *local_1310;
  float *local_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  undefined8 *local_12b8;
  float *local_12b0;
  float *local_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  undefined8 *local_1258;
  float *local_1250;
  float *local_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 *local_11f8;
  float *local_11f0;
  float *local_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined8 *local_1198;
  undefined8 *local_1190;
  float *local_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  undefined8 *local_1138;
  float *local_1130;
  float *local_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined8 *local_10d8;
  float *local_10d0;
  float *local_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  undefined8 *local_1078;
  undefined8 *local_1070;
  float *local_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float fStack_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float fStack_fa8;
  float fStack_fa4;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  float fStack_f64;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float fStack_f28;
  float fStack_f24;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float fStack_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  float local_e80;
  float fStack_e7c;
  float fStack_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  undefined1 local_e20 [8];
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float fStack_df0;
  float fStack_dec;
  float fStack_de8;
  float fStack_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_dc0;
  float fStack_dbc;
  float fStack_db8;
  float fStack_db4;
  float fStack_db0;
  float fStack_dac;
  float fStack_da8;
  float fStack_da4;
  undefined1 local_da0 [32];
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined4 local_c54;
  undefined4 local_c50;
  undefined4 local_c4c;
  undefined4 local_c48;
  undefined4 local_c44;
  undefined4 local_c40;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  undefined4 local_c24;
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined4 local_bc0;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined4 local_bb0;
  undefined4 local_bac;
  undefined4 local_ba8;
  undefined4 local_ba4;
  undefined1 local_ba0 [16];
  undefined1 auStack_b90 [16];
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined4 local_b40;
  undefined4 local_b3c;
  undefined4 local_b38;
  undefined4 local_b34;
  undefined4 local_b30;
  undefined4 local_b2c;
  undefined4 local_b28;
  undefined4 local_b24;
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined4 local_b00;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float local_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float local_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float local_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float *local_5d8;
  float *local_5d0;
  float *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 *local_578;
  float *local_570;
  float *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 *local_518;
  float *local_510;
  float *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 *local_4b8;
  float *local_4b0;
  float *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined8 *local_458;
  undefined8 *local_450;
  float *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined8 *local_3f8;
  float *local_3f0;
  float *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined8 *local_398;
  float *local_390;
  float *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 *local_338;
  undefined8 *local_330;
  float *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_34;
  
  local_19b0 = *(int *)((long)in_RDI + 0x2c);
  local_19b4 = (int)in_RDI[6];
  local_19b8 = *(int *)((long)in_RDI + 0x34);
  local_19bc = (int)in_RDI[7];
  local_19c0 = (int)in_RDI[3];
  local_19c4 = local_19b0 * local_19b4 * local_19b8 * local_19c0;
  local_19a0 = in_RDI;
  for (local_19c8 = 0; local_19c8 < local_19bc; local_19c8 = local_19c8 + 1) {
    local_1988 = &local_1a18;
    local_18dc = *(int *)((long)local_19a0 + 0x2c);
    local_18e0 = (int)local_19a0[6];
    local_18e4 = *(undefined4 *)((long)local_19a0 + 0x34);
    local_18f0 = (undefined1 (*) [32])
                 (*local_19a0 + local_19a0[8] * (long)local_19c8 * local_19a0[2]);
    local_18f8 = local_19a0[2];
    local_18fc = (undefined4)local_19a0[3];
    local_1908 = local_19a0[4];
    local_18d8 = &local_1a18;
    local_18c8 = (long)local_18dc * (long)local_18e0 * local_18f8;
    local_1980 = &local_1a18;
    local_1970 = &local_1a18;
    local_18cc = 0x10;
    local_1994 = local_19c8;
    local_1995 = 1;
    local_1a18 = 0;
    local_1a08 = 0;
    local_1a00 = 0;
    local_19f0 = 0;
    local_19ec = 0;
    local_19e8 = 0;
    local_19e4 = 0;
    local_19e0 = 0;
    local_19d8 = 0;
    local_1a10 = 0;
    local_19d0 = local_18f0;
    for (local_1a1c = 0; local_1a1c + 7 < local_19c4; local_1a1c = local_1a1c + 8) {
      local_1968 = local_19d0;
      auVar3 = *local_19d0;
      local_1888 = local_19a9;
      local_1890 = local_1a40;
      local_1a40._0_8_ = auVar3._0_8_;
      local_1500 = local_1a40._0_8_;
      local_1a40._8_8_ = auVar3._8_8_;
      uStack_14f8 = local_1a40._8_8_;
      local_1a40._16_8_ = auVar3._16_8_;
      uStack_14f0 = local_1a40._16_8_;
      local_1a40._24_8_ = auVar3._24_8_;
      uStack_14e8 = local_1a40._24_8_;
      local_c24 = 0x80000000;
      local_bc0 = 0x80000000;
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      local_be0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      auStack_bd0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      local_1520 = local_be0._0_8_;
      uStack_1518 = local_be0._8_8_;
      uStack_1510 = auStack_bd0._0_8_;
      uStack_1508 = auStack_bd0._8_8_;
      local_c28 = 0x3f800000;
      local_b80 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_ba0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_b90 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1540 = local_ba0._0_8_;
      uStack_1538 = local_ba0._8_8_;
      uStack_1530 = auStack_b90._0_8_;
      uStack_1528 = auStack_b90._8_8_;
      local_c2c = 0xbf800000;
      local_b40 = 0xbf800000;
      auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
      local_b60 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
      auStack_b50 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
      local_1560 = local_b60._0_8_;
      uStack_1558 = local_b60._8_8_;
      uStack_1550 = auStack_b50._0_8_;
      uStack_1548 = auStack_b50._8_8_;
      local_c30 = 0x3fc90fdb;
      local_b00 = 0x3fc90fdb;
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      local_b20 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      auStack_b10 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      local_1580 = local_b20._0_8_;
      uStack_1578 = local_b20._8_8_;
      uStack_1570 = auStack_b10._0_8_;
      uStack_1568 = auStack_b10._8_8_;
      local_c34 = 0x3f800000;
      local_ac0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_ae0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_ad0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_15a0 = local_ae0._0_8_;
      uStack_1598 = local_ae0._8_8_;
      uStack_1590 = auStack_ad0._0_8_;
      uStack_1588 = auStack_ad0._8_8_;
      local_c38 = 0xbeaaaa53;
      local_a80 = 0xbeaaaa53;
      auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
      local_aa0 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
      auStack_a90 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
      local_15c0 = local_aa0._0_8_;
      uStack_15b8 = local_aa0._8_8_;
      uStack_15b0 = auStack_a90._0_8_;
      uStack_15a8 = auStack_a90._8_8_;
      local_c3c = 0x3e4cb974;
      local_a40 = 0x3e4cb974;
      auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
      local_a60 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
      auStack_a50 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
      local_15e0 = local_a60._0_8_;
      uStack_15d8 = local_a60._8_8_;
      uStack_15d0 = auStack_a50._0_8_;
      uStack_15c8 = auStack_a50._8_8_;
      local_c40 = 0xbe117200;
      local_a00 = 0xbe117200;
      auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
      local_a20 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
      auStack_a10 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
      local_1600 = local_a20._0_8_;
      uStack_15f8 = local_a20._8_8_;
      uStack_15f0 = auStack_a10._0_8_;
      uStack_15e8 = auStack_a10._8_8_;
      local_c44 = 0x3dd9ed24;
      local_9c0 = 0x3dd9ed24;
      auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
      local_9e0 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
      auStack_9d0 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
      local_1620 = local_9e0._0_8_;
      uStack_1618 = local_9e0._8_8_;
      uStack_1610 = auStack_9d0._0_8_;
      uStack_1608 = auStack_9d0._8_8_;
      local_c48 = 0xbd99b01e;
      local_980 = 0xbd99b01e;
      auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
      local_9a0 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
      auStack_990 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
      local_1640 = local_9a0._0_8_;
      uStack_1638 = local_9a0._8_8_;
      uStack_1630 = auStack_990._0_8_;
      uStack_1628 = auStack_990._8_8_;
      local_c4c = 0x3d2edd4e;
      local_940 = 0x3d2edd4e;
      auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
      local_960 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
      auStack_950 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
      local_1660 = local_960._0_8_;
      uStack_1658 = local_960._8_8_;
      uStack_1650 = auStack_950._0_8_;
      uStack_1648 = auStack_950._8_8_;
      local_c50 = 0xbc83a25c;
      local_900 = 0xbc83a25c;
      auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
      local_920 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
      auStack_910 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
      local_1680 = local_920._0_8_;
      uStack_1678 = local_920._8_8_;
      uStack_1670 = auStack_910._0_8_;
      uStack_1668 = auStack_910._8_8_;
      local_c54 = 0x3b3ac537;
      local_8c0 = 0x3b3ac537;
      auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
      local_8e0 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
      auStack_8d0 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
      local_16a0 = local_8e0._0_8_;
      uStack_1698 = local_8e0._8_8_;
      uStack_1690 = auStack_8d0._0_8_;
      uStack_1688 = auStack_8d0._8_8_;
      local_1400 = local_be0._0_8_;
      uStack_13f8 = local_be0._8_8_;
      uStack_13f0 = auStack_bd0._0_8_;
      uStack_13e8 = auStack_bd0._8_8_;
      auVar5._16_8_ = auStack_bd0._0_8_;
      auVar5._0_16_ = local_be0;
      auVar5._24_8_ = auStack_bd0._8_8_;
      local_16c0 = vandps_avx(auVar5,auVar3);
      local_c80 = local_be0._0_8_;
      uStack_c78 = local_be0._8_8_;
      uStack_c70 = auStack_bd0._0_8_;
      uStack_c68 = auStack_bd0._8_8_;
      auVar8._16_8_ = auStack_bd0._0_8_;
      auVar8._0_16_ = local_be0;
      auVar8._24_8_ = auStack_bd0._8_8_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_16e0 = vandnps_avx(auVar8,auVar3);
      auVar3._16_8_ = auStack_b90._0_8_;
      auVar3._0_16_ = local_ba0;
      auVar3._24_8_ = auStack_b90._8_8_;
      local_1700 = vcmpps_avx(auVar3,local_16e0,1);
      local_1440 = local_1700._0_8_;
      uStack_1438 = local_1700._8_8_;
      uStack_1430 = local_1700._16_8_;
      uStack_1428 = local_1700._24_8_;
      local_1460 = local_b60._0_8_;
      uStack_1458 = local_b60._8_8_;
      uStack_1450 = auStack_b50._0_8_;
      uStack_1448 = auStack_b50._8_8_;
      auVar4._16_8_ = auStack_b50._0_8_;
      auVar4._0_16_ = local_b60;
      auVar4._24_8_ = auStack_b50._8_8_;
      local_d40 = vandps_avx(local_1700,auVar4);
      local_cc0 = local_1700._0_8_;
      uStack_cb8 = local_1700._8_8_;
      uStack_cb0 = local_1700._16_8_;
      uStack_ca8 = local_1700._24_8_;
      local_ce0 = local_16e0._0_8_;
      uStack_cd8 = local_16e0._8_8_;
      uStack_cd0 = local_16e0._16_8_;
      uStack_cc8 = local_16e0._24_8_;
      local_d60 = vandnps_avx(local_1700,local_16e0);
      local_c00 = vorps_avx(local_d40,local_d60);
      local_1480 = local_1700._0_8_;
      uStack_1478 = local_1700._8_8_;
      uStack_1470 = local_1700._16_8_;
      uStack_1468 = local_1700._24_8_;
      local_14a0 = local_16e0._0_8_;
      uStack_1498 = local_16e0._8_8_;
      uStack_1490 = local_16e0._16_8_;
      uStack_1488 = local_16e0._24_8_;
      local_d80 = vandps_avx(local_1700,local_16e0);
      local_d20 = local_ba0._0_8_;
      uStack_d18 = local_ba0._8_8_;
      uStack_d10 = auStack_b90._0_8_;
      uStack_d08 = auStack_b90._8_8_;
      local_d00._0_4_ = local_1700._0_4_;
      local_d00._4_4_ = local_1700._4_4_;
      local_d00._8_4_ = local_1700._8_4_;
      local_d00._12_4_ = local_1700._12_4_;
      local_d00._16_4_ = local_1700._16_4_;
      local_d00._20_4_ = local_1700._20_4_;
      local_d00._24_4_ = local_1700._24_4_;
      local_d00._28_4_ = local_1700._28_4_;
      auVar16._0_4_ = local_d00._0_4_ ^ auVar1._0_4_;
      auVar16._4_4_ = local_d00._4_4_ ^ auVar1._4_4_;
      auVar16._8_4_ = local_d00._8_4_ ^ auVar1._8_4_;
      auVar16._12_4_ = local_d00._12_4_ ^ auVar1._12_4_;
      auVar16._16_4_ = local_d00._16_4_ ^ auVar1._16_4_;
      auVar16._20_4_ = local_d00._20_4_ ^ auVar1._20_4_;
      auVar16._24_4_ = local_d00._24_4_ ^ auVar1._24_4_;
      auVar16._28_4_ = local_d00._28_4_ ^ auVar1._28_4_;
      auVar7._16_8_ = auStack_b90._0_8_;
      auVar7._0_16_ = local_ba0;
      auVar7._24_8_ = auStack_b90._8_8_;
      in_ZMM3 = ZEXT3264(auVar7);
      local_da0 = vandps_avx(auVar16,auVar7);
      local_c20 = vorps_avx(local_d80,local_da0);
      local_1720 = vdivps_avx(local_c00,local_c20);
      local_1360 = local_1720._0_8_;
      uStack_1358 = local_1720._8_8_;
      uStack_1350 = local_1720._16_8_;
      uStack_1348 = local_1720._24_8_;
      local_1340._0_4_ = local_1720._0_4_;
      local_1340._4_4_ = local_1720._4_4_;
      uStack_1338._0_4_ = local_1720._8_4_;
      uStack_1338._4_4_ = local_1720._12_4_;
      uStack_1330._0_4_ = local_1720._16_4_;
      uStack_1330._4_4_ = local_1720._20_4_;
      uStack_1328._0_4_ = local_1720._24_4_;
      uStack_1328._4_4_ = local_1720._28_4_;
      fStack_1724 = uStack_1328._4_4_;
      local_1740 = (float)local_1340 * (float)local_1340;
      fStack_173c = local_1340._4_4_ * local_1340._4_4_;
      fStack_1738 = (float)uStack_1338 * (float)uStack_1338;
      fStack_1734 = uStack_1338._4_4_ * uStack_1338._4_4_;
      fStack_1730 = (float)uStack_1330 * (float)uStack_1330;
      fStack_172c = uStack_1330._4_4_ * uStack_1330._4_4_;
      fStack_1728 = (float)uStack_1328 * (float)uStack_1328;
      local_1380 = CONCAT44(fStack_173c,local_1740);
      uStack_1378 = CONCAT44(fStack_1734,fStack_1738);
      uStack_1370 = CONCAT44(fStack_172c,fStack_1730);
      uStack_1368 = CONCAT44(uStack_1328._4_4_,fStack_1728);
      local_13a0 = CONCAT44(fStack_173c,local_1740);
      uStack_1398 = CONCAT44(fStack_1734,fStack_1738);
      uStack_1390 = CONCAT44(fStack_172c,fStack_1730);
      uStack_1388 = CONCAT44(uStack_1328._4_4_,fStack_1728);
      fStack_1744 = uStack_1328._4_4_;
      local_1760 = local_1740 * local_1740;
      fStack_175c = fStack_173c * fStack_173c;
      fStack_1758 = fStack_1738 * fStack_1738;
      fStack_1754 = fStack_1734 * fStack_1734;
      fStack_1750 = fStack_1730 * fStack_1730;
      fStack_174c = fStack_172c * fStack_172c;
      fStack_1748 = fStack_1728 * fStack_1728;
      local_1068 = &local_1760;
      local_1070 = &local_1680;
      local_1078 = &local_1640;
      fStack_1024 = uStack_1328._4_4_;
      local_1060._0_4_ = local_920._0_4_;
      local_1060._4_4_ = local_920._4_4_;
      uStack_1058._0_4_ = local_920._8_4_;
      uStack_1058._4_4_ = local_920._12_4_;
      uStack_1050._0_4_ = auStack_910._0_4_;
      uStack_1050._4_4_ = auStack_910._4_4_;
      uStack_1048._0_4_ = auStack_910._8_4_;
      local_1000 = local_1760 * (float)local_1060;
      fStack_ffc = fStack_175c * local_1060._4_4_;
      fStack_ff8 = fStack_1758 * (float)uStack_1058;
      fStack_ff4 = fStack_1754 * uStack_1058._4_4_;
      fStack_ff0 = fStack_1750 * (float)uStack_1050;
      fStack_fec = fStack_174c * uStack_1050._4_4_;
      fStack_fe8 = fStack_1748 * (float)uStack_1048;
      local_1020._0_4_ = local_9a0._0_4_;
      local_1020._4_4_ = local_9a0._4_4_;
      uStack_1018._0_4_ = local_9a0._8_4_;
      uStack_1018._4_4_ = local_9a0._12_4_;
      uStack_1010._0_4_ = auStack_990._0_4_;
      uStack_1010._4_4_ = auStack_990._4_4_;
      uStack_1008._0_4_ = auStack_990._8_4_;
      uStack_1008._4_4_ = auStack_990._12_4_;
      local_17e0 = local_1000 + (float)local_1020;
      fStack_17dc = fStack_ffc + local_1020._4_4_;
      fStack_17d8 = fStack_ff8 + (float)uStack_1018;
      fStack_17d4 = fStack_ff4 + uStack_1018._4_4_;
      fStack_17d0 = fStack_ff0 + (float)uStack_1010;
      fStack_17cc = fStack_fec + uStack_1010._4_4_;
      fStack_17c8 = fStack_fe8 + (float)uStack_1008;
      fStack_17c4 = uStack_1328._4_4_ + uStack_1008._4_4_;
      local_10c8 = &local_1760;
      local_10d0 = &local_17e0;
      local_10d8 = &local_1600;
      fStack_1084 = uStack_1328._4_4_;
      local_10c0 = CONCAT44(fStack_17dc,local_17e0);
      uStack_10b8 = CONCAT44(fStack_17d4,fStack_17d8);
      uStack_10b0 = CONCAT44(fStack_17cc,fStack_17d0);
      uStack_10a8 = CONCAT44(fStack_17c4,fStack_17c8);
      local_fc0 = local_1760 * local_17e0;
      fStack_fbc = fStack_175c * fStack_17dc;
      fStack_fb8 = fStack_1758 * fStack_17d8;
      fStack_fb4 = fStack_1754 * fStack_17d4;
      fStack_fb0 = fStack_1750 * fStack_17d0;
      fStack_fac = fStack_174c * fStack_17cc;
      fStack_fa8 = fStack_1748 * fStack_17c8;
      local_fe0._0_4_ = local_a20._0_4_;
      local_fe0._4_4_ = local_a20._4_4_;
      uStack_fd8._0_4_ = local_a20._8_4_;
      uStack_fd8._4_4_ = local_a20._12_4_;
      uStack_fd0._0_4_ = auStack_a10._0_4_;
      uStack_fd0._4_4_ = auStack_a10._4_4_;
      uStack_fc8._0_4_ = auStack_a10._8_4_;
      uStack_fc8._4_4_ = auStack_a10._12_4_;
      local_17c0 = local_fc0 + (float)local_fe0;
      fStack_17bc = fStack_fbc + local_fe0._4_4_;
      fStack_17b8 = fStack_fb8 + (float)uStack_fd8;
      fStack_17b4 = fStack_fb4 + uStack_fd8._4_4_;
      fStack_17b0 = fStack_fb0 + (float)uStack_fd0;
      fStack_17ac = fStack_fac + uStack_fd0._4_4_;
      fStack_17a8 = fStack_fa8 + (float)uStack_fc8;
      fStack_17a4 = uStack_1328._4_4_ + uStack_fc8._4_4_;
      local_1128 = &local_1760;
      local_1130 = &local_17c0;
      local_1138 = &local_15c0;
      fStack_10e4 = uStack_1328._4_4_;
      local_1120 = CONCAT44(fStack_17bc,local_17c0);
      uStack_1118 = CONCAT44(fStack_17b4,fStack_17b8);
      uStack_1110 = CONCAT44(fStack_17ac,fStack_17b0);
      uStack_1108 = CONCAT44(fStack_17a4,fStack_17a8);
      local_f80 = local_1760 * local_17c0;
      fStack_f7c = fStack_175c * fStack_17bc;
      fStack_f78 = fStack_1758 * fStack_17b8;
      fStack_f74 = fStack_1754 * fStack_17b4;
      fStack_f70 = fStack_1750 * fStack_17b0;
      fStack_f6c = fStack_174c * fStack_17ac;
      fStack_f68 = fStack_1748 * fStack_17a8;
      local_fa0._0_4_ = local_aa0._0_4_;
      local_fa0._4_4_ = local_aa0._4_4_;
      uStack_f98._0_4_ = local_aa0._8_4_;
      uStack_f98._4_4_ = local_aa0._12_4_;
      uStack_f90._0_4_ = auStack_a90._0_4_;
      uStack_f90._4_4_ = auStack_a90._4_4_;
      uStack_f88._0_4_ = auStack_a90._8_4_;
      uStack_f88._4_4_ = auStack_a90._12_4_;
      local_17a0 = local_f80 + (float)local_fa0;
      fStack_179c = fStack_f7c + local_fa0._4_4_;
      fStack_1798 = fStack_f78 + (float)uStack_f98;
      fStack_1794 = fStack_f74 + uStack_f98._4_4_;
      fStack_1790 = fStack_f70 + (float)uStack_f90;
      fStack_178c = fStack_f6c + uStack_f90._4_4_;
      fStack_1788 = fStack_f68 + (float)uStack_f88;
      fStack_1784 = uStack_1328._4_4_ + uStack_f88._4_4_;
      local_1188 = &local_1760;
      local_1190 = &local_16a0;
      local_1198 = &local_1660;
      fStack_1144 = uStack_1328._4_4_;
      local_1180._0_4_ = local_8e0._0_4_;
      local_1180._4_4_ = local_8e0._4_4_;
      uStack_1178._0_4_ = local_8e0._8_4_;
      uStack_1178._4_4_ = local_8e0._12_4_;
      uStack_1170._0_4_ = auStack_8d0._0_4_;
      uStack_1170._4_4_ = auStack_8d0._4_4_;
      uStack_1168._0_4_ = auStack_8d0._8_4_;
      local_f40 = local_1760 * (float)local_1180;
      fStack_f3c = fStack_175c * local_1180._4_4_;
      fStack_f38 = fStack_1758 * (float)uStack_1178;
      fStack_f34 = fStack_1754 * uStack_1178._4_4_;
      fStack_f30 = fStack_1750 * (float)uStack_1170;
      fStack_f2c = fStack_174c * uStack_1170._4_4_;
      fStack_f28 = fStack_1748 * (float)uStack_1168;
      local_f60._0_4_ = local_960._0_4_;
      local_f60._4_4_ = local_960._4_4_;
      uStack_f58._0_4_ = local_960._8_4_;
      uStack_f58._4_4_ = local_960._12_4_;
      uStack_f50._0_4_ = auStack_950._0_4_;
      uStack_f50._4_4_ = auStack_950._4_4_;
      uStack_f48._0_4_ = auStack_950._8_4_;
      uStack_f48._4_4_ = auStack_950._12_4_;
      local_1860 = local_f40 + (float)local_f60;
      fStack_185c = fStack_f3c + local_f60._4_4_;
      fStack_1858 = fStack_f38 + (float)uStack_f58;
      fStack_1854 = fStack_f34 + uStack_f58._4_4_;
      fStack_1850 = fStack_f30 + (float)uStack_f50;
      fStack_184c = fStack_f2c + uStack_f50._4_4_;
      fStack_1848 = fStack_f28 + (float)uStack_f48;
      fStack_1844 = uStack_1328._4_4_ + uStack_f48._4_4_;
      local_11e8 = &local_1760;
      local_11f0 = &local_1860;
      local_11f8 = &local_1620;
      fStack_11a4 = uStack_1328._4_4_;
      local_11e0 = CONCAT44(fStack_185c,local_1860);
      uStack_11d8 = CONCAT44(fStack_1854,fStack_1858);
      uStack_11d0 = CONCAT44(fStack_184c,fStack_1850);
      uStack_11c8 = CONCAT44(fStack_1844,fStack_1848);
      local_f00 = local_1760 * local_1860;
      fStack_efc = fStack_175c * fStack_185c;
      fStack_ef8 = fStack_1758 * fStack_1858;
      fStack_ef4 = fStack_1754 * fStack_1854;
      fStack_ef0 = fStack_1750 * fStack_1850;
      fStack_eec = fStack_174c * fStack_184c;
      fStack_ee8 = fStack_1748 * fStack_1848;
      local_f20._0_4_ = local_9e0._0_4_;
      local_f20._4_4_ = local_9e0._4_4_;
      uStack_f18._0_4_ = local_9e0._8_4_;
      uStack_f18._4_4_ = local_9e0._12_4_;
      uStack_f10._0_4_ = auStack_9d0._0_4_;
      uStack_f10._4_4_ = auStack_9d0._4_4_;
      uStack_f08._0_4_ = auStack_9d0._8_4_;
      uStack_f08._4_4_ = auStack_9d0._12_4_;
      local_1840 = local_f00 + (float)local_f20;
      fStack_183c = fStack_efc + local_f20._4_4_;
      fStack_1838 = fStack_ef8 + (float)uStack_f18;
      fStack_1834 = fStack_ef4 + uStack_f18._4_4_;
      fStack_1830 = fStack_ef0 + (float)uStack_f10;
      fStack_182c = fStack_eec + uStack_f10._4_4_;
      fStack_1828 = fStack_ee8 + (float)uStack_f08;
      fStack_1824 = uStack_1328._4_4_ + uStack_f08._4_4_;
      local_1248 = &local_1760;
      local_1250 = &local_1840;
      local_1258 = &local_15e0;
      fStack_1204 = uStack_1328._4_4_;
      local_1240 = CONCAT44(fStack_183c,local_1840);
      uStack_1238 = CONCAT44(fStack_1834,fStack_1838);
      uStack_1230 = CONCAT44(fStack_182c,fStack_1830);
      uStack_1228 = CONCAT44(fStack_1824,fStack_1828);
      local_ec0 = local_1760 * local_1840;
      fStack_ebc = fStack_175c * fStack_183c;
      fStack_eb8 = fStack_1758 * fStack_1838;
      fStack_eb4 = fStack_1754 * fStack_1834;
      fStack_eb0 = fStack_1750 * fStack_1830;
      fStack_eac = fStack_174c * fStack_182c;
      fStack_ea8 = fStack_1748 * fStack_1828;
      local_ee0._0_4_ = local_a60._0_4_;
      local_ee0._4_4_ = local_a60._4_4_;
      uStack_ed8._0_4_ = local_a60._8_4_;
      uStack_ed8._4_4_ = local_a60._12_4_;
      uStack_ed0._0_4_ = auStack_a50._0_4_;
      uStack_ed0._4_4_ = auStack_a50._4_4_;
      uStack_ec8._0_4_ = auStack_a50._8_4_;
      uStack_ec8._4_4_ = auStack_a50._12_4_;
      local_1820 = local_ec0 + (float)local_ee0;
      fStack_181c = fStack_ebc + local_ee0._4_4_;
      fStack_1818 = fStack_eb8 + (float)uStack_ed8;
      fStack_1814 = fStack_eb4 + uStack_ed8._4_4_;
      fStack_1810 = fStack_eb0 + (float)uStack_ed0;
      fStack_180c = fStack_eac + uStack_ed0._4_4_;
      fStack_1808 = fStack_ea8 + (float)uStack_ec8;
      fStack_1804 = uStack_1328._4_4_ + uStack_ec8._4_4_;
      local_12a8 = &local_1760;
      local_12b0 = &local_1820;
      local_12b8 = &local_15a0;
      fStack_1264 = uStack_1328._4_4_;
      local_12a0 = CONCAT44(fStack_181c,local_1820);
      uStack_1298 = CONCAT44(fStack_1814,fStack_1818);
      uStack_1290 = CONCAT44(fStack_180c,fStack_1810);
      uStack_1288 = CONCAT44(fStack_1804,fStack_1808);
      local_e80 = local_1760 * local_1820;
      fStack_e7c = fStack_175c * fStack_181c;
      fStack_e78 = fStack_1758 * fStack_1818;
      fStack_e74 = fStack_1754 * fStack_1814;
      fStack_e70 = fStack_1750 * fStack_1810;
      fStack_e6c = fStack_174c * fStack_180c;
      fStack_e68 = fStack_1748 * fStack_1808;
      local_ea0._0_4_ = local_ae0._0_4_;
      local_ea0._4_4_ = local_ae0._4_4_;
      uStack_e98._0_4_ = local_ae0._8_4_;
      uStack_e98._4_4_ = local_ae0._12_4_;
      uStack_e90._0_4_ = auStack_ad0._0_4_;
      uStack_e90._4_4_ = auStack_ad0._4_4_;
      uStack_e88._0_4_ = auStack_ad0._8_4_;
      uStack_e88._4_4_ = auStack_ad0._12_4_;
      local_1800 = local_e80 + (float)local_ea0;
      fStack_17fc = fStack_e7c + local_ea0._4_4_;
      fStack_17f8 = fStack_e78 + (float)uStack_e98;
      fStack_17f4 = fStack_e74 + uStack_e98._4_4_;
      fStack_17f0 = fStack_e70 + (float)uStack_e90;
      fStack_17ec = fStack_e6c + uStack_e90._4_4_;
      fStack_17e8 = fStack_e68 + (float)uStack_e88;
      fStack_17e4 = uStack_1328._4_4_ + uStack_e88._4_4_;
      local_1308 = &local_1740;
      local_1310 = &local_17a0;
      local_1318 = &local_1800;
      fStack_12c4 = uStack_1328._4_4_;
      local_1300 = CONCAT44(fStack_179c,local_17a0);
      uStack_12f8 = CONCAT44(fStack_1794,fStack_1798);
      uStack_12f0 = CONCAT44(fStack_178c,fStack_1790);
      uStack_12e8 = CONCAT44(fStack_1784,fStack_1788);
      local_e40 = local_1740 * local_17a0;
      fStack_e3c = fStack_173c * fStack_179c;
      fStack_e38 = fStack_1738 * fStack_1798;
      fStack_e34 = fStack_1734 * fStack_1794;
      fStack_e30 = fStack_1730 * fStack_1790;
      fStack_e2c = fStack_172c * fStack_178c;
      fStack_e28 = fStack_1728 * fStack_1788;
      local_e60 = CONCAT44(fStack_17fc,local_1800);
      uStack_e58 = CONCAT44(fStack_17f4,fStack_17f8);
      uStack_e50 = CONCAT44(fStack_17ec,fStack_17f0);
      uStack_e48 = CONCAT44(fStack_17e4,fStack_17e8);
      local_1780 = local_e40 + local_1800;
      fStack_177c = fStack_e3c + fStack_17fc;
      fStack_1778 = fStack_e38 + fStack_17f8;
      fStack_1774 = fStack_e34 + fStack_17f4;
      fStack_1770 = fStack_e30 + fStack_17f0;
      fStack_176c = fStack_e2c + fStack_17ec;
      fStack_1768 = fStack_e28 + fStack_17e8;
      fStack_1764 = uStack_1328._4_4_ + fStack_17e4;
      local_13e0 = local_1720._0_8_;
      uStack_13d8 = local_1720._8_8_;
      uStack_13d0 = local_1720._16_8_;
      uStack_13c8 = local_1720._24_8_;
      local_e00 = local_1780 * (float)local_1340;
      fStack_dfc = fStack_177c * local_1340._4_4_;
      fStack_df8 = fStack_1778 * (float)uStack_1338;
      fStack_df4 = fStack_1774 * uStack_1338._4_4_;
      fStack_df0 = fStack_1770 * (float)uStack_1330;
      fStack_dec = fStack_176c * uStack_1330._4_4_;
      fStack_de8 = fStack_1768 * (float)uStack_1328;
      local_14c0 = local_1700._0_8_;
      uStack_14b8 = local_1700._8_8_;
      uStack_14b0 = local_1700._16_8_;
      uStack_14a8 = local_1700._24_8_;
      local_14e0 = local_b20._0_8_;
      uStack_14d8 = local_b20._8_8_;
      uStack_14d0 = auStack_b10._0_8_;
      uStack_14c8 = auStack_b10._8_8_;
      auVar1._16_8_ = auStack_b10._0_8_;
      auVar1._0_16_ = local_b20;
      auVar1._24_8_ = auStack_b10._8_8_;
      _local_e20 = vandps_avx(local_1700,auVar1);
      local_dc0 = local_e00 + (float)local_e20._0_4_;
      fStack_dbc = fStack_dfc + (float)local_e20._4_4_;
      fStack_db8 = fStack_df8 + fStack_e18;
      fStack_db4 = fStack_df4 + fStack_e14;
      fStack_db0 = fStack_df0 + fStack_e10;
      fStack_dac = fStack_dec + fStack_e0c;
      fStack_da8 = fStack_de8 + fStack_e08;
      fStack_da4 = fStack_1764 + fStack_e04;
      local_de0 = local_16c0._0_8_;
      uStack_dd8 = local_16c0._8_8_;
      uStack_dd0 = local_16c0._16_8_;
      uStack_dc8 = local_16c0._24_8_;
      auVar6._4_4_ = fStack_dbc;
      auVar6._0_4_ = local_dc0;
      auVar6._8_4_ = fStack_db8;
      auVar6._12_4_ = fStack_db4;
      auVar6._16_4_ = fStack_db0;
      auVar6._20_4_ = fStack_dac;
      auVar6._24_4_ = fStack_da8;
      auVar6._28_4_ = fStack_da4;
      local_1a40 = vorps_avx(auVar6,local_16c0);
      local_1930 = local_19d0;
      local_1960 = local_1a40._0_8_;
      uStack_1958 = local_1a40._8_8_;
      uStack_1950 = local_1a40._16_8_;
      uStack_1948 = local_1a40._24_8_;
      *local_19d0 = local_1a40;
      local_19d0 = local_19d0 + 1;
      local_1420 = local_1500;
      uStack_1418 = uStack_14f8;
      uStack_1410 = uStack_14f0;
      uStack_1408 = uStack_14e8;
      local_13c0 = local_1780;
      fStack_13bc = fStack_177c;
      fStack_13b8 = fStack_1778;
      fStack_13b4 = fStack_1774;
      fStack_13b0 = fStack_1770;
      fStack_13ac = fStack_176c;
      fStack_13a8 = fStack_1768;
      fStack_13a4 = fStack_1764;
      local_1340 = local_1720._0_8_;
      uStack_1338 = local_1720._8_8_;
      uStack_1330 = local_1720._16_8_;
      uStack_1328 = local_1720._24_8_;
      local_12e0 = local_1740;
      fStack_12dc = fStack_173c;
      fStack_12d8 = fStack_1738;
      fStack_12d4 = fStack_1734;
      fStack_12d0 = fStack_1730;
      fStack_12cc = fStack_172c;
      fStack_12c8 = fStack_1728;
      local_1280 = local_1760;
      fStack_127c = fStack_175c;
      fStack_1278 = fStack_1758;
      fStack_1274 = fStack_1754;
      fStack_1270 = fStack_1750;
      fStack_126c = fStack_174c;
      fStack_1268 = fStack_1748;
      local_1220 = local_1760;
      fStack_121c = fStack_175c;
      fStack_1218 = fStack_1758;
      fStack_1214 = fStack_1754;
      fStack_1210 = fStack_1750;
      fStack_120c = fStack_174c;
      fStack_1208 = fStack_1748;
      local_11c0 = local_1760;
      fStack_11bc = fStack_175c;
      fStack_11b8 = fStack_1758;
      fStack_11b4 = fStack_1754;
      fStack_11b0 = fStack_1750;
      fStack_11ac = fStack_174c;
      fStack_11a8 = fStack_1748;
      local_1180 = local_8e0._0_8_;
      uStack_1178 = local_8e0._8_8_;
      uStack_1170 = auStack_8d0._0_8_;
      uStack_1168 = auStack_8d0._8_8_;
      local_1160 = local_1760;
      fStack_115c = fStack_175c;
      fStack_1158 = fStack_1758;
      fStack_1154 = fStack_1754;
      fStack_1150 = fStack_1750;
      fStack_114c = fStack_174c;
      fStack_1148 = fStack_1748;
      local_1100 = local_1760;
      fStack_10fc = fStack_175c;
      fStack_10f8 = fStack_1758;
      fStack_10f4 = fStack_1754;
      fStack_10f0 = fStack_1750;
      fStack_10ec = fStack_174c;
      fStack_10e8 = fStack_1748;
      local_10a0 = local_1760;
      fStack_109c = fStack_175c;
      fStack_1098 = fStack_1758;
      fStack_1094 = fStack_1754;
      fStack_1090 = fStack_1750;
      fStack_108c = fStack_174c;
      fStack_1088 = fStack_1748;
      local_1060 = local_920._0_8_;
      uStack_1058 = local_920._8_8_;
      uStack_1050 = auStack_910._0_8_;
      uStack_1048 = auStack_910._8_8_;
      local_1040 = local_1760;
      fStack_103c = fStack_175c;
      fStack_1038 = fStack_1758;
      fStack_1034 = fStack_1754;
      fStack_1030 = fStack_1750;
      fStack_102c = fStack_174c;
      fStack_1028 = fStack_1748;
      local_1020 = local_9a0._0_8_;
      uStack_1018 = local_9a0._8_8_;
      uStack_1010 = auStack_990._0_8_;
      uStack_1008 = auStack_990._8_8_;
      fStack_fe4 = fStack_1024;
      local_fe0 = local_a20._0_8_;
      uStack_fd8 = local_a20._8_8_;
      uStack_fd0 = auStack_a10._0_8_;
      uStack_fc8 = auStack_a10._8_8_;
      fStack_fa4 = fStack_1084;
      local_fa0 = local_aa0._0_8_;
      uStack_f98 = local_aa0._8_8_;
      uStack_f90 = auStack_a90._0_8_;
      uStack_f88 = auStack_a90._8_8_;
      fStack_f64 = fStack_10e4;
      local_f60 = local_960._0_8_;
      uStack_f58 = local_960._8_8_;
      uStack_f50 = auStack_950._0_8_;
      uStack_f48 = auStack_950._8_8_;
      fStack_f24 = fStack_1144;
      local_f20 = local_9e0._0_8_;
      uStack_f18 = local_9e0._8_8_;
      uStack_f10 = auStack_9d0._0_8_;
      uStack_f08 = auStack_9d0._8_8_;
      fStack_ee4 = fStack_11a4;
      local_ee0 = local_a60._0_8_;
      uStack_ed8 = local_a60._8_8_;
      uStack_ed0 = auStack_a50._0_8_;
      uStack_ec8 = auStack_a50._8_8_;
      fStack_ea4 = fStack_1204;
      local_ea0 = local_ae0._0_8_;
      uStack_e98 = local_ae0._8_8_;
      uStack_e90 = auStack_ad0._0_8_;
      uStack_e88 = auStack_ad0._8_8_;
      fStack_e64 = fStack_1264;
      fStack_e24 = fStack_12c4;
      fStack_de4 = fStack_1764;
      local_d00 = local_1700;
      local_ca0 = local_1500;
      uStack_c98 = uStack_14f8;
      uStack_c90 = uStack_14f0;
      uStack_c88 = uStack_14e8;
      local_bbc = local_bc0;
      local_bb8 = local_bc0;
      local_bb4 = local_bc0;
      local_bb0 = local_bc0;
      local_bac = local_bc0;
      local_ba8 = local_bc0;
      local_ba4 = local_bc0;
      local_b7c = local_b80;
      local_b78 = local_b80;
      local_b74 = local_b80;
      local_b70 = local_b80;
      local_b6c = local_b80;
      local_b68 = local_b80;
      local_b64 = local_b80;
      local_b3c = local_b40;
      local_b38 = local_b40;
      local_b34 = local_b40;
      local_b30 = local_b40;
      local_b2c = local_b40;
      local_b28 = local_b40;
      local_b24 = local_b40;
      local_afc = local_b00;
      local_af8 = local_b00;
      local_af4 = local_b00;
      local_af0 = local_b00;
      local_aec = local_b00;
      local_ae8 = local_b00;
      local_ae4 = local_b00;
      local_abc = local_ac0;
      local_ab8 = local_ac0;
      local_ab4 = local_ac0;
      local_ab0 = local_ac0;
      local_aac = local_ac0;
      local_aa8 = local_ac0;
      local_aa4 = local_ac0;
      local_a7c = local_a80;
      local_a78 = local_a80;
      local_a74 = local_a80;
      local_a70 = local_a80;
      local_a6c = local_a80;
      local_a68 = local_a80;
      local_a64 = local_a80;
      local_a3c = local_a40;
      local_a38 = local_a40;
      local_a34 = local_a40;
      local_a30 = local_a40;
      local_a2c = local_a40;
      local_a28 = local_a40;
      local_a24 = local_a40;
      local_9fc = local_a00;
      local_9f8 = local_a00;
      local_9f4 = local_a00;
      local_9f0 = local_a00;
      local_9ec = local_a00;
      local_9e8 = local_a00;
      local_9e4 = local_a00;
      local_9bc = local_9c0;
      local_9b8 = local_9c0;
      local_9b4 = local_9c0;
      local_9b0 = local_9c0;
      local_9ac = local_9c0;
      local_9a8 = local_9c0;
      local_9a4 = local_9c0;
      local_97c = local_980;
      local_978 = local_980;
      local_974 = local_980;
      local_970 = local_980;
      local_96c = local_980;
      local_968 = local_980;
      local_964 = local_980;
      local_93c = local_940;
      local_938 = local_940;
      local_934 = local_940;
      local_930 = local_940;
      local_92c = local_940;
      local_928 = local_940;
      local_924 = local_940;
      local_8fc = local_900;
      local_8f8 = local_900;
      local_8f4 = local_900;
      local_8f0 = local_900;
      local_8ec = local_900;
      local_8e8 = local_900;
      local_8e4 = local_900;
      local_8bc = local_8c0;
      local_8b8 = local_8c0;
      local_8b4 = local_8c0;
      local_8b0 = local_8c0;
      local_8ac = local_8c0;
      local_8a8 = local_8c0;
      local_8a4 = local_8c0;
    }
    for (; local_18b8 = local_1970, local_19f8 = local_1908, local_1a1c + 3 < local_19c4;
        local_1a1c = local_1a1c + 4) {
      local_1928 = local_19d0;
      auVar9 = *(undefined1 (*) [16])*local_19d0;
      local_1878 = local_19a9;
      local_1880 = local_1a50;
      local_1a50._0_8_ = auVar9._0_8_;
      local_6f0 = local_1a50._0_8_;
      local_1a50._8_8_ = auVar9._8_8_;
      uStack_6e8 = local_1a50._8_8_;
      local_54 = 0x80000000;
      local_34 = 0x80000000;
      local_50 = 0x80000000;
      local_700 = 0x8000000080000000;
      uStack_6f8 = 0x8000000080000000;
      local_74 = 0x3f800000;
      local_58 = 0x3f800000;
      local_70 = 0x3f800000;
      local_710 = 0x3f8000003f800000;
      uStack_708 = 0x3f8000003f800000;
      local_94 = 0xbf800000;
      local_78 = 0xbf800000;
      local_90 = 0xbf800000;
      local_720 = 0xbf800000bf800000;
      uStack_718 = 0xbf800000bf800000;
      local_b4 = 0x3fc90fdb;
      local_98 = 0x3fc90fdb;
      local_b0 = 0x3fc90fdb;
      local_730 = 0x3fc90fdb3fc90fdb;
      uStack_728 = 0x3fc90fdb3fc90fdb;
      local_d4 = 0x3f800000;
      local_b8 = 0x3f800000;
      local_d0 = 0x3f800000;
      local_740 = 0x3f8000003f800000;
      uStack_738 = 0x3f8000003f800000;
      local_f4 = 0xbeaaaa53;
      local_d8 = 0xbeaaaa53;
      local_f0 = 0xbeaaaa53;
      local_750 = 0xbeaaaa53beaaaa53;
      uStack_748 = 0xbeaaaa53beaaaa53;
      local_114 = 0x3e4cb974;
      local_f8 = 0x3e4cb974;
      local_110 = 0x3e4cb974;
      local_760 = 0x3e4cb9743e4cb974;
      uStack_758 = 0x3e4cb9743e4cb974;
      local_134 = 0xbe117200;
      local_118 = 0xbe117200;
      local_130 = 0xbe117200;
      local_770 = 0xbe117200be117200;
      uStack_768 = 0xbe117200be117200;
      local_154 = 0x3dd9ed24;
      local_138 = 0x3dd9ed24;
      local_150 = 0x3dd9ed24;
      local_780 = 0x3dd9ed243dd9ed24;
      uStack_778 = 0x3dd9ed243dd9ed24;
      local_174 = 0xbd99b01e;
      local_158 = 0xbd99b01e;
      local_170 = 0xbd99b01e;
      local_790 = 0xbd99b01ebd99b01e;
      uStack_788 = 0xbd99b01ebd99b01e;
      local_194 = 0x3d2edd4e;
      local_178 = 0x3d2edd4e;
      local_190 = 0x3d2edd4e;
      local_7a0 = 0x3d2edd4e3d2edd4e;
      uStack_798 = 0x3d2edd4e3d2edd4e;
      local_1b4 = 0xbc83a25c;
      local_198 = 0xbc83a25c;
      local_1b0 = 0xbc83a25c;
      local_7b0 = 0xbc83a25cbc83a25c;
      uStack_7a8 = 0xbc83a25cbc83a25c;
      local_1d4 = 0x3b3ac537;
      local_1b8 = 0x3b3ac537;
      local_1d0 = 0x3b3ac537;
      local_7c0 = 0x3b3ac5373b3ac537;
      uStack_7b8 = 0x3b3ac5373b3ac537;
      auVar10._8_8_ = 0x8000000080000000;
      auVar10._0_8_ = 0x8000000080000000;
      local_7d0 = vpand_avx(auVar10,auVar9);
      auVar14._8_8_ = 0x8000000080000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar2 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
      local_7e0 = vpandn_avx(auVar14,auVar9);
      local_280 = local_7e0._0_8_;
      uStack_278 = local_7e0._8_8_;
      auVar12._8_8_ = 0x3f8000003f800000;
      auVar12._0_8_ = 0x3f8000003f800000;
      local_7f0 = vcmpps_avx(auVar12,local_7e0,1);
      local_690 = local_7f0._0_8_;
      uStack_688 = local_7f0._8_8_;
      auVar9._8_8_ = 0xbf800000bf800000;
      auVar9._0_8_ = 0xbf800000bf800000;
      local_290 = vpand_avx(local_7f0,auVar9);
      local_230 = local_7f0._0_8_;
      uStack_228 = local_7f0._8_8_;
      local_240 = local_7e0._0_8_;
      uStack_238 = local_7e0._8_8_;
      local_2a0 = vpandn_avx(local_7f0,local_7e0);
      local_1f0 = vpor_avx(local_290,local_2a0);
      local_6b0 = local_7f0._0_8_;
      uStack_6a8 = local_7f0._8_8_;
      local_6c0 = local_7e0._0_8_;
      uStack_6b8 = local_7e0._8_8_;
      local_2b0 = vpand_avx(local_7f0,local_7e0);
      auVar13._8_8_ = 0x3f8000003f800000;
      auVar13._0_8_ = 0x3f8000003f800000;
      in_ZMM3 = ZEXT1664(auVar13);
      local_2c0 = vpand_avx(local_7f0 ^ auVar2,auVar13);
      local_200 = vpor_avx(local_2b0,local_2c0);
      local_800 = vdivps_avx(local_1f0,local_200);
      local_620 = local_800._0_8_;
      uStack_618 = local_800._8_8_;
      local_610._0_4_ = local_800._0_4_;
      local_610._4_4_ = local_800._4_4_;
      uStack_608._0_4_ = local_800._8_4_;
      uStack_608._4_4_ = local_800._12_4_;
      local_810 = (float)local_610 * (float)local_610;
      fStack_80c = local_610._4_4_ * local_610._4_4_;
      fStack_808 = (float)uStack_608 * (float)uStack_608;
      fStack_804 = uStack_608._4_4_ * uStack_608._4_4_;
      local_630 = CONCAT44(fStack_80c,local_810);
      uStack_628 = CONCAT44(fStack_804,fStack_808);
      local_640 = CONCAT44(fStack_80c,local_810);
      uStack_638 = CONCAT44(fStack_804,fStack_808);
      local_820 = local_810 * local_810;
      fStack_81c = fStack_80c * fStack_80c;
      fStack_818 = fStack_808 * fStack_808;
      fStack_814 = fStack_804 * fStack_804;
      local_328 = &local_820;
      local_330 = &local_7b0;
      local_338 = &local_790;
      local_310 = CONCAT44(fStack_81c,local_820);
      uStack_308 = CONCAT44(fStack_814,fStack_818);
      local_320 = 0xbc83a25cbc83a25c;
      uStack_318 = 0xbc83a25cbc83a25c;
      local_2f0 = local_820 * -0.01606863;
      fStack_2ec = fStack_81c * -0.01606863;
      fStack_2e8 = fStack_818 * -0.01606863;
      fStack_2e4 = fStack_814 * -0.01606863;
      local_300 = 0xbd99b01ebd99b01e;
      uStack_2f8 = 0xbd99b01ebd99b01e;
      local_860 = local_2f0 + -0.07504295;
      fStack_85c = fStack_2ec + -0.07504295;
      fStack_858 = fStack_2e8 + -0.07504295;
      fStack_854 = fStack_2e4 + -0.07504295;
      local_388 = &local_820;
      local_390 = &local_860;
      local_398 = &local_770;
      local_370 = CONCAT44(fStack_81c,local_820);
      uStack_368 = CONCAT44(fStack_814,fStack_818);
      local_380 = CONCAT44(fStack_85c,local_860);
      uStack_378 = CONCAT44(fStack_854,fStack_858);
      local_350 = local_820 * local_860;
      fStack_34c = fStack_81c * fStack_85c;
      fStack_348 = fStack_818 * fStack_858;
      fStack_344 = fStack_814 * fStack_854;
      local_360 = 0xbe117200be117200;
      uStack_358 = 0xbe117200be117200;
      local_850 = local_350 + -0.14203644;
      fStack_84c = fStack_34c + -0.14203644;
      fStack_848 = fStack_348 + -0.14203644;
      fStack_844 = fStack_344 + -0.14203644;
      local_3e8 = &local_820;
      local_3f0 = &local_850;
      local_3f8 = &local_750;
      local_3d0 = CONCAT44(fStack_81c,local_820);
      uStack_3c8 = CONCAT44(fStack_814,fStack_818);
      local_3e0 = CONCAT44(fStack_84c,local_850);
      uStack_3d8 = CONCAT44(fStack_844,fStack_848);
      local_3b0 = local_820 * local_850;
      fStack_3ac = fStack_81c * fStack_84c;
      fStack_3a8 = fStack_818 * fStack_848;
      fStack_3a4 = fStack_814 * fStack_844;
      local_3c0 = 0xbeaaaa53beaaaa53;
      uStack_3b8 = 0xbeaaaa53beaaaa53;
      local_840 = local_3b0 + -0.33333072;
      fStack_83c = fStack_3ac + -0.33333072;
      fStack_838 = fStack_3a8 + -0.33333072;
      fStack_834 = fStack_3a4 + -0.33333072;
      local_448 = &local_820;
      local_450 = &local_7c0;
      local_458 = &local_7a0;
      local_430 = CONCAT44(fStack_81c,local_820);
      uStack_428 = CONCAT44(fStack_814,fStack_818);
      local_440 = 0x3b3ac5373b3ac537;
      uStack_438 = 0x3b3ac5373b3ac537;
      local_410 = local_820 * 0.0028498897;
      fStack_40c = fStack_81c * 0.0028498897;
      fStack_408 = fStack_818 * 0.0028498897;
      fStack_404 = fStack_814 * 0.0028498897;
      local_420 = 0x3d2edd4e3d2edd4e;
      uStack_418 = 0x3d2edd4e3d2edd4e;
      local_8a0 = local_410 + 0.04269152;
      fStack_89c = fStack_40c + 0.04269152;
      fStack_898 = fStack_408 + 0.04269152;
      fStack_894 = fStack_404 + 0.04269152;
      local_4a8 = &local_820;
      local_4b0 = &local_8a0;
      local_4b8 = &local_780;
      local_490 = CONCAT44(fStack_81c,local_820);
      uStack_488 = CONCAT44(fStack_814,fStack_818);
      local_4a0 = CONCAT44(fStack_89c,local_8a0);
      uStack_498 = CONCAT44(fStack_894,fStack_898);
      local_470 = local_820 * local_8a0;
      fStack_46c = fStack_81c * fStack_89c;
      fStack_468 = fStack_818 * fStack_898;
      fStack_464 = fStack_814 * fStack_894;
      local_480 = 0x3dd9ed243dd9ed24;
      uStack_478 = 0x3dd9ed243dd9ed24;
      local_890 = local_470 + 0.10640934;
      fStack_88c = fStack_46c + 0.10640934;
      fStack_888 = fStack_468 + 0.10640934;
      fStack_884 = fStack_464 + 0.10640934;
      local_508 = &local_820;
      local_510 = &local_890;
      local_518 = &local_760;
      local_4f0 = CONCAT44(fStack_81c,local_820);
      uStack_4e8 = CONCAT44(fStack_814,fStack_818);
      local_500 = CONCAT44(fStack_88c,local_890);
      uStack_4f8 = CONCAT44(fStack_884,fStack_888);
      local_4d0 = local_820 * local_890;
      fStack_4cc = fStack_81c * fStack_88c;
      fStack_4c8 = fStack_818 * fStack_888;
      fStack_4c4 = fStack_814 * fStack_884;
      local_4e0 = 0x3e4cb9743e4cb974;
      uStack_4d8 = 0x3e4cb9743e4cb974;
      local_880 = local_4d0 + 0.1999262;
      fStack_87c = fStack_4cc + 0.1999262;
      fStack_878 = fStack_4c8 + 0.1999262;
      fStack_874 = fStack_4c4 + 0.1999262;
      local_568 = &local_820;
      local_570 = &local_880;
      local_578 = &local_740;
      local_550 = CONCAT44(fStack_81c,local_820);
      uStack_548 = CONCAT44(fStack_814,fStack_818);
      local_560 = CONCAT44(fStack_87c,local_880);
      uStack_558 = CONCAT44(fStack_874,fStack_878);
      local_530 = local_820 * local_880;
      fStack_52c = fStack_81c * fStack_87c;
      fStack_528 = fStack_818 * fStack_878;
      fStack_524 = fStack_814 * fStack_874;
      local_540 = 0x3f8000003f800000;
      uStack_538 = 0x3f8000003f800000;
      local_870 = local_530 + 1.0;
      fStack_86c = fStack_52c + 1.0;
      fStack_868 = fStack_528 + 1.0;
      fStack_864 = fStack_524 + 1.0;
      local_5c8 = &local_810;
      local_5d0 = &local_840;
      local_5d8 = &local_870;
      local_5b0 = CONCAT44(fStack_80c,local_810);
      uStack_5a8 = CONCAT44(fStack_804,fStack_808);
      local_5c0 = CONCAT44(fStack_83c,local_840);
      uStack_5b8 = CONCAT44(fStack_834,fStack_838);
      local_590 = local_810 * local_840;
      fStack_58c = fStack_80c * fStack_83c;
      fStack_588 = fStack_808 * fStack_838;
      fStack_584 = fStack_804 * fStack_834;
      local_5a0 = CONCAT44(fStack_86c,local_870);
      uStack_598 = CONCAT44(fStack_864,fStack_868);
      local_830 = local_590 + local_870;
      fStack_82c = fStack_58c + fStack_86c;
      fStack_828 = fStack_588 + fStack_868;
      fStack_824 = fStack_584 + fStack_864;
      local_650 = CONCAT44(fStack_82c,local_830);
      uStack_648 = CONCAT44(fStack_824,fStack_828);
      local_660 = local_800._0_8_;
      uStack_658 = local_800._8_8_;
      local_5f0 = local_830 * (float)local_610;
      fStack_5ec = fStack_82c * local_610._4_4_;
      fStack_5e8 = fStack_828 * (float)uStack_608;
      fStack_5e4 = fStack_824 * uStack_608._4_4_;
      local_6d0 = local_7f0._0_8_;
      uStack_6c8 = local_7f0._8_8_;
      auVar2._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar2._0_8_ = 0x3fc90fdb3fc90fdb;
      _local_600 = vpand_avx(local_7f0,auVar2);
      local_2d0 = local_5f0 + (float)local_600._0_4_;
      fStack_2cc = fStack_5ec + (float)local_600._4_4_;
      fStack_2c8 = fStack_5e8 + fStack_5f8;
      fStack_2c4 = fStack_5e4 + fStack_5f4;
      local_2e0 = local_7d0._0_8_;
      uStack_2d8 = local_7d0._8_8_;
      auVar11._4_4_ = fStack_2cc;
      auVar11._0_4_ = local_2d0;
      auVar11._8_4_ = fStack_2c8;
      auVar11._12_4_ = fStack_2c4;
      local_1a50 = vpor_avx(auVar11,local_7d0);
      local_1910 = local_19d0;
      local_1920 = local_1a50._0_8_;
      uStack_1918 = local_1a50._8_8_;
      *(undefined1 (*) [16])*local_19d0 = local_1a50;
      local_19d0 = (undefined1 (*) [32])(*local_19d0 + 0x10);
      local_6e0 = local_730;
      uStack_6d8 = uStack_728;
      local_6a0 = local_720;
      uStack_698 = uStack_718;
      local_680 = local_6f0;
      uStack_678 = uStack_6e8;
      local_670 = local_700;
      uStack_668 = uStack_6f8;
      local_610 = local_800._0_8_;
      uStack_608 = local_800._8_8_;
      local_270 = local_710;
      uStack_268 = uStack_708;
      local_260 = local_710;
      uStack_258 = uStack_708;
      local_250 = local_7f0;
      local_220 = local_6f0;
      uStack_218 = uStack_6e8;
      local_210 = local_700;
      uStack_208 = uStack_6f8;
      uStack_1cc = local_1d0;
      uStack_1c8 = local_1d0;
      uStack_1c4 = local_1d0;
      uStack_1ac = local_1b0;
      uStack_1a8 = local_1b0;
      uStack_1a4 = local_1b0;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
      uStack_4c = local_50;
      uStack_48 = local_50;
      uStack_44 = local_50;
    }
    for (; local_1a1c < local_19c4; local_1a1c = local_1a1c + 1) {
      local_1868 = local_19a9;
      local_1870 = local_19d0;
      in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
      fVar15 = atanf(*(float *)*local_19d0);
      *(float *)*local_19d0 = fVar15;
      local_19d0 = (undefined1 (*) [32])(*local_19d0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}